

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::compare_types_cast<TestDerivedType>
               (_func_TestDerivedType *param_1,Function_Params *params,
               Type_Conversions_State *t_conversions)

{
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_TestDerivedType *param_0_local;
  
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }